

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O2

void __thiscall
irr::video::CImage::copyToScalingBoxFilter(CImage *this,IImage *target,s32 bias,bool blend)

{
  u32 x;
  ulong uVar1;
  u32 y;
  uint uVar2;
  float __x;
  float fVar3;
  float fVar4;
  float __x_00;
  float fVar5;
  float __x_01;
  float fVar6;
  float __x_02;
  u32 local_4c;
  ulong local_48;
  CImage *local_40;
  ulong local_38;
  
  local_38 = (ulong)(target->Size).Width;
  local_48 = (ulong)(target->Size).Height;
  __x = (float)(this->super_IImage).Size.Width / (float)local_38;
  __x_02 = (float)(this->super_IImage).Size.Height / (float)local_48;
  local_40 = this;
  fVar3 = ceilf(__x);
  fVar4 = ceilf(__x_02);
  __x_00 = 0.0;
  for (uVar2 = 0; uVar2 != (uint)local_48; uVar2 = uVar2 + 1) {
    fVar5 = floorf(__x_00);
    __x_01 = 0.0;
    for (uVar1 = 0; (int)local_38 != (int)uVar1; uVar1 = (ulong)((int)uVar1 + 1)) {
      fVar6 = floorf(__x_01);
      local_4c = (u32)getPixelBox(local_40,(int)fVar6,(int)fVar5,(int)fVar3,(int)fVar4,bias);
      (*target->_vptr_IImage[3])(target,uVar1,(ulong)uVar2,&local_4c,(ulong)blend);
      __x_01 = __x_01 + __x;
    }
    __x_00 = __x_00 + __x_02;
  }
  return;
}

Assistant:

void CImage::copyToScalingBoxFilter(IImage *target, s32 bias, bool blend)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::copyToScalingBoxFilter method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	const core::dimension2d<u32> destSize = target->getDimension();

	const f32 sourceXStep = (f32)Size.Width / (f32)destSize.Width;
	const f32 sourceYStep = (f32)Size.Height / (f32)destSize.Height;

	s32 fx = core::ceil32(sourceXStep);
	s32 fy = core::ceil32(sourceYStep);
	f32 sx;
	f32 sy;

	sy = 0.f;
	for (u32 y = 0; y != destSize.Height; ++y) {
		sx = 0.f;
		for (u32 x = 0; x != destSize.Width; ++x) {
			target->setPixel(x, y,
					getPixelBox(core::floor32(sx), core::floor32(sy), fx, fy, bias), blend);
			sx += sourceXStep;
		}
		sy += sourceYStep;
	}
}